

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBJ.cpp
# Opt level: O0

void __thiscall
Iir::RBJ::LowShelf::setupN(LowShelf *this,double cutoffFrequency,double gainDb,double shelfSlope)

{
  double in_RDI;
  double in_XMM0_Qa;
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double a2;
  double a1;
  double a0;
  double b2;
  double b1;
  double b0;
  double sq;
  double AL;
  double sn;
  double cs;
  double w0;
  double A;
  
  __x = pow(10.0,in_XMM1_Qa / 40.0);
  dVar1 = cos(in_XMM0_Qa * 6.283185307179586);
  dVar2 = sin(in_XMM0_Qa * 6.283185307179586);
  dVar2 = dVar2 / 2.0;
  dVar3 = sqrt((__x + 1.0 / __x) * (1.0 / in_XMM2_Qa - 1.0) + 2.0);
  dVar3 = dVar2 * dVar3;
  dVar4 = sqrt(__x);
  dVar3 = dVar4 * 2.0 * dVar3;
  Biquad::setCoefficients
            ((Biquad *)(__x * 2.0 * (-(__x + 1.0) * dVar1 + (__x - 1.0))),
             __x * ((-(__x - 1.0) * dVar1 + __x + 1.0) - dVar3),
             (__x - 1.0) * dVar1 + __x + 1.0 + dVar3,((__x + 1.0) * dVar1 + (__x - 1.0)) * -2.0,
             ((__x - 1.0) * dVar1 + __x + 1.0) - dVar3,in_RDI,dVar2);
  return;
}

Assistant:

void LowShelf::setupN (double cutoffFrequency,
			      double gainDb,
			      double shelfSlope)
	{
		double A  = pow (10, gainDb/40);
		double w0 = 2 * doublePi * cutoffFrequency;
		double cs = cos (w0);
		double sn = sin (w0);
		double AL = sn / 2 * ::std::sqrt ((A + 1/A) * (1/shelfSlope - 1) + 2);
		double sq = 2 * sqrt(A) * AL;
		double b0 =    A*( (A+1) - (A-1)*cs + sq );
		double b1 =  2*A*( (A-1) - (A+1)*cs );
		double b2 =    A*( (A+1) - (A-1)*cs - sq );
		double a0 =        (A+1) + (A-1)*cs + sq;
		double a1 =   -2*( (A-1) + (A+1)*cs );
		double a2 =        (A+1) + (A-1)*cs - sq;
		setCoefficients (a0, a1, a2, b0, b1, b2);
	}